

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O2

void diy::
     reduce<diy::detail::KDTreePartition<BlockT,PointT>,diy::detail::KDTreePartners,diy::detail::ReduceNeverSkip>
               (Master *master,Assigner *assigner,KDTreePartners *partners,
               KDTreePartition<BlockT,_PointT> *reduce,ReduceNeverSkip *skip)

{
  int iVar1;
  bool bVar2;
  IncomingQueues *this;
  uint uVar3;
  int round_;
  uint round;
  ulong uVar4;
  ulong uVar5;
  shared_ptr<diy::spd::logger> log;
  vector<int,_std::allocator<int>_> incoming_gids;
  int local_3a8;
  Skip local_390;
  Callback local_370;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_348;
  SkipInactiveOr<diy::detail::KDTreePartners,_diy::detail::ReduceNeverSkip> local_340;
  _Any_data local_328;
  code *local_318;
  code *local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  code *local_2f8;
  code *local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  code *local_2d8;
  code *local_2d0;
  ReductionFunctor<BlockT,_diy::detail::KDTreePartners> local_2c8;
  
  std::make_shared<diy::spd::logger>();
  iVar1 = master->expected_;
  uVar4 = 0;
  while( true ) {
    round_ = (int)uVar4;
    if ((ulong)((long)(partners->rounds_).
                      super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(partners->rounds_).
                      super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar4) break;
    std::function<void(BlockT*,diy::ReduceProxy_const&,diy::detail::KDTreePartners_const&)>::
    function<diy::detail::KDTreePartition<BlockT,PointT>const&,void>
              ((function<void(BlockT*,diy::ReduceProxy_const&,diy::detail::KDTreePartners_const&)> *
               )&local_370,reduce);
    detail::ReductionFunctor<BlockT,_diy::detail::KDTreePartners>::ReductionFunctor
              (&local_2c8,round_,&local_370,partners,assigner);
    local_340.round = round_;
    local_340.partners = partners;
    std::function<bool(int,diy::Master_const&)>::
    function<diy::detail::SkipInactiveOr<diy::detail::KDTreePartners,diy::detail::ReduceNeverSkip>,void>
              ((function<bool(int,diy::Master_const&)> *)&local_390,&local_340);
    Master::foreach<diy::detail::ReductionFunctor<BlockT,diy::detail::KDTreePartners>>
              (master,&local_2c8,&local_390);
    std::_Function_base::~_Function_base(&local_390.super__Function_base);
    detail::ReductionFunctor<BlockT,_diy::detail::KDTreePartners>::~ReductionFunctor(&local_2c8);
    std::_Function_base::~_Function_base(&local_370.super__Function_base);
    Master::execute(master);
    round = round_ + 1;
    uVar4 = (ulong)round;
    local_3a8 = 0;
    for (uVar3 = 0;
        uVar3 < (uint)((ulong)((long)(master->blocks_).elements_.
                                     super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(master->blocks_).elements_.
                                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3); uVar3 = uVar3 + 1) {
      bVar2 = detail::KDTreePartners::active
                        (partners,round,
                         (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)uVar3],master);
      if (bVar2) {
        local_2c8.reduce.super__Function_base._M_functor._8_8_ = 0;
        local_2c8._0_8_ = 0;
        local_2c8.reduce.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
        detail::KDTreePartners::incoming
                  (partners,round,
                   (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar3],
                   (vector<int,_std::allocator<int>_> *)&local_2c8,master);
        uVar5 = (long)local_2c8.reduce.super__Function_base._M_functor._M_unused._0_8_ -
                local_2c8._0_8_;
        this = Master::incoming(master,(master->gids_).super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[(int)uVar3]);
        concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
        ::clear(this);
        local_3a8 = local_3a8 + (int)(uVar5 >> 2);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_2c8);
      }
    }
    master->expected_ = local_3a8;
    local_328._M_unused._M_object = (void *)0x0;
    local_328._8_8_ = 0;
    local_310 = std::
                _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                ::_M_invoke;
    local_318 = std::
                _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                ::_M_manager;
    local_308 = 0;
    uStack_300 = 0;
    local_2f0 = std::
                _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                ::_M_invoke;
    local_2f8 = std::
                _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                ::_M_manager;
    local_2e8 = 0;
    uStack_2e0 = 0;
    local_2d0 = std::
                _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                ::_M_invoke;
    local_2d8 = std::
                _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                ::_M_manager;
    Master::flush(master,false,(MemoryManagement *)&local_328);
    MemoryManagement::~MemoryManagement((MemoryManagement *)&local_328);
  }
  std::function<void(BlockT*,diy::ReduceProxy_const&,diy::detail::KDTreePartners_const&)>::
  function<diy::detail::KDTreePartition<BlockT,PointT>const&,void>
            ((function<void(BlockT*,diy::ReduceProxy_const&,diy::detail::KDTreePartners_const&)> *)
             &local_370,reduce);
  detail::ReductionFunctor<BlockT,_diy::detail::KDTreePartners>::ReductionFunctor
            (&local_2c8,round_,&local_370,partners,assigner);
  local_340.round = round_;
  local_340.partners = partners;
  std::function<bool(int,diy::Master_const&)>::
  function<diy::detail::SkipInactiveOr<diy::detail::KDTreePartners,diy::detail::ReduceNeverSkip>,void>
            ((function<bool(int,diy::Master_const&)> *)&local_390,&local_340);
  Master::foreach<diy::detail::ReductionFunctor<BlockT,diy::detail::KDTreePartners>>
            (master,&local_2c8,&local_390);
  std::_Function_base::~_Function_base(&local_390.super__Function_base);
  detail::ReductionFunctor<BlockT,_diy::detail::KDTreePartners>::~ReductionFunctor(&local_2c8);
  std::_Function_base::~_Function_base(&local_370.super__Function_base);
  master->expected_ = iVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_348);
  return;
}

Assistant:

void reduce(Master&                    master,        //!< master object
            const Assigner&            assigner,      //!< assigner object
            const Partners&            partners,      //!< partners object
            const Reduce&              reduce,        //!< reduction callback function
            const Skip&                skip)          //!< object determining whether a block should be skipped
{
  auto log = get_logger();

  int original_expected = master.expected();

  using Block = typename detail::block_traits<Reduce>::type;

  unsigned round;
  for (round = 0; round < partners.rounds(); ++round)
  {
    log->debug("Round {}", round);
    master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                   detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));
    master.execute();

    int expected = 0;
    for (unsigned i = 0; i < master.size(); ++i)
    {
      if (partners.active(round + 1, master.gid(i), master))
      {
        std::vector<int> incoming_gids;
        partners.incoming(round + 1, master.gid(i), incoming_gids, master);
        expected += static_cast<int>(incoming_gids.size());
        master.incoming(master.gid(i)).clear();
      }
    }
    master.set_expected(expected);
    master.flush(false);
  }
  // final round
  log->debug("Round {}", round);
  master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                 detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));

  master.set_expected(original_expected);
}